

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

Value * __thiscall
GlobOptBlockData::MergeValues
          (GlobOptBlockData *this,Value *toDataValue,Value *fromDataValue,Sym *fromDataSym,
          bool isLoopBackEdge,bool forceUniqueValue,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  ValueNumberPairToValueMap *pVVar4;
  Type piVar5;
  GlobOpt *this_00;
  Sym *sym;
  Value *pVVar6;
  code *pcVar7;
  KeyValueEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*> *pKVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  ValueInfo *valueInfo;
  Type pSVar13;
  undefined4 *puVar14;
  uint uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 local_68 [8];
  ValueNumberPair sourceValueNumberPair;
  
  if (toDataValue != fromDataValue) {
    local_68._0_4_ = toDataValue->valueNumber;
    local_68._4_4_ = fromDataValue->valueNumber;
    sourceValueNumberPair.first._0_1_ = 1;
    puVar12 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::First
                        ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_68);
    uVar11 = *puVar12;
    puVar12 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::Second
                        ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_68);
    uVar3 = *puVar12;
    valueInfo = MergeValueInfo(this,toDataValue,fromDataValue,fromDataSym,isLoopBackEdge,
                               uVar11 == uVar3,symsRequiringCompensation,symsCreatedForMerge);
    if (valueInfo == (ValueInfo *)0x0) {
      toDataValue = (Value *)0x0;
    }
    else if ((uVar11 != uVar3) || (valueInfo != toDataValue->valueInfo)) {
      if (forceUniqueValue) {
        register0x00000000 = GlobOpt::NewValue(this->globOpt,valueInfo);
      }
      else {
        pVVar4 = this->globOpt->valuesCreatedForMerge;
        piVar5 = pVVar4->buckets;
        uVar10 = 0;
        if (piVar5 != (Type)0x0) {
          uVar10 = JsUtil::
                   BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetBucket((local_68._4_4_ + local_68._0_4_) * 2 + 1,pVVar4->bucketCount,
                               pVVar4->modFunctionIndex);
          uVar15 = piVar5[uVar10];
          uVar10 = 0;
          if (-1 < (int)uVar15) {
            pSVar13 = pVVar4->entries;
            uVar10 = 0;
            do {
              pKVar8 = &pSVar13[uVar15].
                        super_DefaultHashedEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .
                        super_KeyValueEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
              ;
              uVar1 = (pKVar8->
                      super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>_>
                      ).
                      super_KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                      .key.first;
              uVar2 = (pKVar8->
                      super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>_>
                      ).
                      super_KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                      .key.second;
              auVar17._0_4_ = -(uint)(uVar1 == local_68._0_4_);
              auVar17._4_4_ = -(uint)(uVar2 == local_68._4_4_);
              auVar17._8_4_ = 0xffffffff;
              auVar17._12_4_ = 0xffffffff;
              auVar17 = pmovsxdq(auVar17,auVar17);
              iVar16 = movmskpd(uVar15,auVar17);
              if (iVar16 == 3) {
                if (pVVar4->stats != (DictionaryStats *)0x0) {
                  DictionaryStats::Lookup(pVVar4->stats,uVar10);
                  pSVar13 = pVVar4->entries;
                }
                pVVar6 = pSVar13[uVar15].
                         super_DefaultHashedEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .
                         super_KeyValueEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                         .
                         super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>_>
                         .
                         super_KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                         .value;
                unique0x10000444 = pVVar6;
                if (pVVar6 == (Value *)0x0) goto LAB_004921c2;
                if ((pVVar6->valueNumber != toDataValue->valueNumber) == (uVar11 == uVar3)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                  *puVar14 = 1;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                     ,0x38b,
                                     "(sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber()))"
                                     ,
                                     "sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber())"
                                    );
                  if (!bVar9) {
                    pcVar7 = (code *)invalidInstructionException();
                    (*pcVar7)();
                  }
                  *puVar14 = 0;
                }
                pVVar6->valueInfo = valueInfo;
                goto LAB_00492219;
              }
              uVar10 = uVar10 + 1;
              uVar15 = pSVar13[uVar15].
                       super_DefaultHashedEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .
                       super_KeyValueEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                       .
                       super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>_>
                       .
                       super_KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                       .next;
            } while (-1 < (int)uVar15);
          }
        }
        if (pVVar4->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(pVVar4->stats,uVar10);
        }
LAB_004921c2:
        this_00 = this->globOpt;
        if (uVar11 == uVar3) {
          puVar12 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::First
                              ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_68);
          uVar11 = *puVar12;
        }
        else {
          uVar11 = GlobOpt::NewValueNumber(this_00);
        }
        register0x00000000 = GlobOpt::NewValue(this_00,uVar11,valueInfo);
        JsUtil::
        BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this->globOpt->valuesCreatedForMerge,
                   (Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_68,
                   (Value **)&sourceValueNumberPair.initialized);
      }
LAB_00492219:
      sym = toDataValue->valueInfo->symStore;
      toDataValue = stack0xffffffffffffffa8;
      if (sym == fromDataValue->valueInfo->symStore) {
        GlobOpt::SetSymStoreDirect(this->globOpt,valueInfo,sym);
        toDataValue = stack0xffffffffffffffa8;
      }
    }
  }
  return toDataValue;
}

Assistant:

Value *
GlobOptBlockData::MergeValues(
    Value *toDataValue,
    Value *fromDataValue,
    Sym *fromDataSym,
    bool isLoopBackEdge,
    bool forceUniqueValue,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    // Same map
    if (toDataValue == fromDataValue)
    {
        return toDataValue;
    }

    const ValueNumberPair sourceValueNumberPair(toDataValue->GetValueNumber(), fromDataValue->GetValueNumber());
    const bool sameValueNumber = sourceValueNumberPair.First() == sourceValueNumberPair.Second();

    ValueInfo *newValueInfo =
        this->MergeValueInfo(
            toDataValue,
            fromDataValue,
            fromDataSym,
            isLoopBackEdge,
            sameValueNumber,
            symsRequiringCompensation,
            symsCreatedForMerge);

    if (newValueInfo == nullptr)
    {
        return nullptr;
    }

    if (sameValueNumber && newValueInfo == toDataValue->GetValueInfo())
    {
        return toDataValue;
    }

    Value *newValue = nullptr;
    if (forceUniqueValue)
    {
        newValue = this->globOpt->NewValue(newValueInfo);
    }
    else
    {
        // There may be other syms in toData that haven't been merged yet, referring to the current toData value for this sym. If
        // the merge produced a new value info, don't corrupt the value info for the other sym by changing the same value. Instead,
        // create one value per source value number pair per merge and reuse that for new value infos.
        newValue = this->globOpt->valuesCreatedForMerge->Lookup(sourceValueNumberPair, nullptr);
        if (newValue)
        {
            Assert(sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber()));

            // This is an exception where Value::SetValueInfo is called directly instead of GlobOpt::ChangeValueInfo, because we're
            // actually generating new value info through merges.
            newValue->SetValueInfo(newValueInfo);
        }
        else
        {
            newValue = this->globOpt->NewValue(sameValueNumber ? sourceValueNumberPair.First() : this->globOpt->NewValueNumber(), newValueInfo);
            this->globOpt->valuesCreatedForMerge->Add(sourceValueNumberPair, newValue);
        }
    }

    // Set symStore if same on both paths.
    if (toDataValue->GetValueInfo()->GetSymStore() == fromDataValue->GetValueInfo()->GetSymStore())
    {
        this->globOpt->SetSymStoreDirect(newValueInfo, toDataValue->GetValueInfo()->GetSymStore());
    }

    return newValue;
}